

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::detail::ReferenceResolver::resolve(ReferenceResolver *this)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  size_t sVar3;
  size_t sVar4;
  long in_RDI;
  refdata *rd;
  size_t e;
  size_t i;
  refdata *in_stack_00000448;
  ReferenceResolver *in_stack_00000450;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  Location *in_stack_ffffffffffffff80;
  ReferenceResolver *in_stack_ffffffffffffffa8;
  ulong local_50;
  char (*in_stack_ffffffffffffffc0) [25];
  char (*pacVar5) [25];
  size_t local_38;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  Location *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  ulong uVar6;
  
  store_anchors_and_refs(in_stack_ffffffffffffffa8);
  sVar3 = stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::empty
                    ((stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *)(in_RDI + 8));
  if (sVar3 == 0) {
    local_50 = 0;
    sVar3 = stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::size
                      ((stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *)(in_RDI + 8));
    for (; local_50 < sVar3; local_50 = local_50 + 1) {
      uVar6 = local_50;
      if (*(ulong *)(in_RDI + 0x310) <= local_50) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        Location::Location(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff80 = in_stack_ffffffffffffffe0;
        in_stack_ffffffffffffff78 = in_stack_ffffffffffffffd8;
        in_stack_ffffffffffffff70 = in_stack_ffffffffffffffd0;
        loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff78;
        loc.super_LineCol.offset = in_stack_ffffffffffffff70;
        loc.super_LineCol.col = (size_t)in_stack_ffffffffffffff80;
        loc.name.str = (char *)in_stack_ffffffffffffffe8;
        loc.name.len = uVar6;
        in_stack_ffffffffffffff68 = local_38;
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffff70;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffff78;
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffff80;
        error<25ul>(in_stack_ffffffffffffffc0,loc);
      }
      in_stack_ffffffffffffffc0 =
           (char (*) [25])
           (*(long *)(in_RDI + 0x308) + ((*(long *)(in_RDI + 0x310) + -1) - uVar6) * 0x30);
      if ((*(ulong *)*in_stack_ffffffffffffffc0 & 0xc0) != 0) {
        pacVar5 = in_stack_ffffffffffffffc0;
        sVar4 = lookup_(in_stack_00000450,in_stack_00000448);
        *(size_t *)(*in_stack_ffffffffffffffc0 + 0x18) = sVar4;
        in_stack_ffffffffffffffc0 = pacVar5;
      }
    }
  }
  return;
}

Assistant:

void resolve()
    {
        store_anchors_and_refs();
        if(refs.empty())
            return;

        /* from the specs: "an alias node refers to the most recent
         * node in the serialization having the specified anchor". So
         * we need to start looking upward from ref nodes.
         *
         * @see http://yaml.org/spec/1.2/spec.html#id2765878 */
        for(size_t i = 0, e = refs.size(); i < e; ++i)
        {
            auto &C4_RESTRICT rd = refs.top(i);
            if( ! rd.type.is_ref())
                continue;
            rd.target = lookup_(&rd);
        }
    }